

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O2

int run_test_udp_alloc_cb_fail(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  sockaddr_in addr;
  undefined1 local_158 [16];
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_udp_bind(&server,&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
        if (iVar1 == 0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          if (iVar1 == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_udp_init(uVar2,&client);
            if (iVar1 == 0) {
              local_158 = uv_buf_init("PING",4);
              iVar1 = uv_udp_send(&req,&client,local_158,1,&addr,cl_send_cb);
              if (iVar1 == 0) {
                if (close_cb_called == 0) {
                  if (cl_send_cb_called == 0) {
                    if (cl_recv_cb_called == 0) {
                      if (sv_send_cb_called == 0) {
                        if (sv_recv_cb_called == 0) {
                          uVar2 = uv_default_loop();
                          uv_run(uVar2,0);
                          if (cl_send_cb_called == 1) {
                            if (cl_recv_cb_called == 1) {
                              if (sv_send_cb_called == 1) {
                                if (sv_recv_cb_called == 1) {
                                  if (close_cb_called == 2) {
                                    uVar2 = uv_default_loop();
                                    uv_walk(uVar2,close_walk_cb,0);
                                    uv_run(uVar2,0);
                                    uVar2 = uv_default_loop();
                                    iVar1 = uv_loop_close(uVar2);
                                    if (iVar1 == 0) {
                                      uv_library_shutdown();
                                      return 0;
                                    }
                                    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                                    uVar2 = 0xc2;
                                  }
                                  else {
                                    pcVar3 = "close_cb_called == 2";
                                    uVar2 = 0xc0;
                                  }
                                }
                                else {
                                  pcVar3 = "sv_recv_cb_called == 1";
                                  uVar2 = 0xbf;
                                }
                              }
                              else {
                                pcVar3 = "sv_send_cb_called == 1";
                                uVar2 = 0xbe;
                              }
                            }
                            else {
                              pcVar3 = "cl_recv_cb_called == 1";
                              uVar2 = 0xbd;
                            }
                          }
                          else {
                            pcVar3 = "cl_send_cb_called == 1";
                            uVar2 = 0xbc;
                          }
                        }
                        else {
                          pcVar3 = "sv_recv_cb_called == 0";
                          uVar2 = 0xb8;
                        }
                      }
                      else {
                        pcVar3 = "sv_send_cb_called == 0";
                        uVar2 = 0xb7;
                      }
                    }
                    else {
                      pcVar3 = "cl_recv_cb_called == 0";
                      uVar2 = 0xb6;
                    }
                  }
                  else {
                    pcVar3 = "cl_send_cb_called == 0";
                    uVar2 = 0xb5;
                  }
                }
                else {
                  pcVar3 = "close_cb_called == 0";
                  uVar2 = 0xb4;
                }
              }
              else {
                pcVar3 = "r == 0";
                uVar2 = 0xb2;
              }
            }
            else {
              pcVar3 = "r == 0";
              uVar2 = 0xa9;
            }
          }
          else {
            pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
            uVar2 = 0xa6;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0xa4;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0xa1;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x9e;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uVar2 = 0x9b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-alloc-cb-fail.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_send_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);
  ASSERT(sv_recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_send_cb_called == 1);
  ASSERT(cl_recv_cb_called == 1);
  ASSERT(sv_send_cb_called == 1);
  ASSERT(sv_recv_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}